

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v8::detail::default_arg_formatter<char16_t>::operator()
          (default_arg_formatter<char16_t> *this,longdouble value)

{
  basic_format_specs<char16_t> specs;
  long lVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar2;
  byte bStack_d;
  uint local_4;
  
  local_4 = CONCAT31(local_4._1_3_,1);
  lVar1 = (ulong)local_4 << 0x20;
  specs.fill.data_[0] = L' ';
  specs.fill.data_[1] = L'\0';
  specs._8_4_ = (uint)bStack_d << 0x18;
  specs.width = 0;
  specs.precision = -1;
  specs.fill.data_[2] = (short)lVar1;
  specs.fill.data_[3] = (short)((ulong)lVar1 >> 0x10);
  specs.fill.size_ = (char)((ulong)lVar1 >> 0x20);
  specs.fill._9_1_ = (char)((ulong)lVar1 >> 0x28);
  specs._22_2_ = (short)((ulong)lVar1 >> 0x30);
  bVar2 = write<char16_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_long_double,_0>
                    ((this->out).container,value,specs,(locale_ref)0x0);
  return (iterator)bVar2.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }